

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexbuffers.h
# Opt level: O2

void __thiscall flexbuffers::Builder::Finish(Builder *this)

{
  Value *this_00;
  uint8_t byte_width;
  uint8_t val;
  BitWidth alignment;
  
  this_00 = (this->stack_).
            super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((long)(this->stack_).
            super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
            ._M_impl.super__Vector_impl_data._M_finish - (long)this_00 == 0x10) {
    alignment = Value::ElemWidth(this_00,(long)(this->buf_).
                                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                               ._M_impl.super__Vector_impl_data._M_finish -
                                         (long)(this->buf_).
                                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                               ._M_impl.super__Vector_impl_data._M_start,0);
    byte_width = Align(this,alignment);
    WriteAny(this,(this->stack_).
                  super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
                  ._M_impl.super__Vector_impl_data._M_start,byte_width);
    val = Value::StoredPackedType
                    ((this->stack_).
                     super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
                     ._M_impl.super__Vector_impl_data._M_start,BIT_WIDTH_8);
    Write<unsigned_char>(this,val,1);
    Write<unsigned_char>(this,byte_width,1);
    this->finished_ = true;
    return;
  }
  __assert_fail("stack_.size() == 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/flexbuffers.h"
                ,0x580,"void flexbuffers::Builder::Finish()");
}

Assistant:

void Finish() {
    // If you hit this assert, you likely have objects that were never included
    // in a parent. You need to have exactly one root to finish a buffer.
    // Check your Start/End calls are matched, and all objects are inside
    // some other object.
    FLATBUFFERS_ASSERT(stack_.size() == 1);

    // Write root value.
    auto byte_width = Align(stack_[0].ElemWidth(buf_.size(), 0));
    WriteAny(stack_[0], byte_width);
    // Write root type.
    Write(stack_[0].StoredPackedType(), 1);
    // Write root size. Normally determined by parent, but root has no parent :)
    Write(byte_width, 1);

    finished_ = true;
  }